

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O1

int Map_LibraryGetMaxSuperPi_rec(Map_Super_t *pGate)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  
  if (pGate->pRoot == (Mio_Gate_t *)0x0) {
    iVar2 = pGate->Num;
  }
  else {
    uVar3 = *(uint *)&pGate->field_0x4 >> 2 & 7;
    if (uVar3 == 0) {
      iVar2 = 0;
    }
    else {
      uVar4 = 0;
      iVar2 = 0;
      do {
        iVar1 = Map_LibraryGetMaxSuperPi_rec(pGate->pFanins[uVar4]);
        if (iVar2 <= iVar1) {
          iVar2 = iVar1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  return iVar2;
}

Assistant:

int Map_LibraryGetMaxSuperPi_rec( Map_Super_t * pGate )
{
    int i, VarCur, VarMax = 0;
    if ( pGate->pRoot == NULL )
        return pGate->Num;
    for ( i = 0; i < (int)pGate->nFanins; i++ )
    {
        VarCur = Map_LibraryGetMaxSuperPi_rec( pGate->pFanins[i] );
        if ( VarMax < VarCur )
            VarMax = VarCur;
    }
    return VarMax;
}